

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall
Assimp::ValidateDSProcess::DoValidationEx<aiLight>
          (ValidateDSProcess *this,aiLight **parray,uint size,char *firstName,char *secondName)

{
  bool bVar1;
  uint local_38;
  uint local_34;
  uint a;
  uint i;
  char *secondName_local;
  char *firstName_local;
  uint size_local;
  aiLight **parray_local;
  ValidateDSProcess *this_local;
  
  if (size != 0) {
    if (parray == (aiLight **)0x0) {
      ReportError(this,"aiScene::%s is NULL (aiScene::%s is %i)",firstName,secondName,(ulong)size);
    }
    for (local_34 = 0; local_34 < size; local_34 = local_34 + 1) {
      if (parray[local_34] == (aiLight *)0x0) {
        ReportError(this,"aiScene::%s[%u] is NULL (aiScene::%s is %u)",firstName,(ulong)local_34,
                    secondName,(ulong)size);
      }
      Validate(this,parray[local_34]);
      local_38 = local_34;
      while (local_38 = local_38 + 1, local_38 < size) {
        bVar1 = aiString::operator==(&parray[local_34]->mName,&parray[local_38]->mName);
        if (bVar1) {
          ReportError(this,"aiScene::%s[%u] has the same name as aiScene::%s[%u]",firstName,
                      (ulong)local_34,secondName,(ulong)local_38);
        }
      }
    }
  }
  return;
}

Assistant:

inline void ValidateDSProcess::DoValidationEx(T** parray, unsigned int size,
    const char* firstName, const char* secondName)
{
    // validate all entries
    if (size)
    {
        if (!parray)    {
            ReportError("aiScene::%s is NULL (aiScene::%s is %i)",
                firstName, secondName, size);
        }
        for (unsigned int i = 0; i < size;++i)
        {
            if (!parray[i])
            {
                ReportError("aiScene::%s[%u] is NULL (aiScene::%s is %u)",
                    firstName,i,secondName,size);
            }
            Validate(parray[i]);

            // check whether there are duplicate names
            for (unsigned int a = i+1; a < size;++a)
            {
                if (parray[i]->mName == parray[a]->mName)
                {
                	ReportError("aiScene::%s[%u] has the same name as "
                        "aiScene::%s[%u]",firstName, i,secondName, a);
                }
            }
        }
    }
}